

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O3

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::processArg
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,StringRef *arg)

{
  SwitchKind switchKind;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  SwitchInfo *pSVar4;
  C *pCVar5;
  size_t first;
  String switchName;
  String value;
  StringRef local_98;
  StringRef local_78;
  StringRef local_58;
  ulong local_38;
  
  if (((this->super_CmdLineParserRoot).m_flags & 1) != 0) {
    bVar1 = CmdLineParser::onValue((CmdLineParser *)this,arg);
    return bVar1;
  }
  local_78.m_length._0_1_ = 0;
  local_78.m_length._1_7_ = 0;
  local_78.m_isNullTerminated = false;
  local_78.m_p = (C *)0x0;
  local_78.m_hdr._0_1_ = 0;
  local_78.m_hdr._1_7_ = 0;
  local_58.m_length._0_1_ = 0;
  local_58._17_8_ = 0;
  local_58.m_p = (C *)0x0;
  local_58.m_hdr._0_1_ = 0;
  local_58.m_hdr._1_7_ = 0;
  local_38 = arg->m_length;
  if ((local_38 < 2) || (*arg->m_p != '-')) {
    bVar2 = processValue(this,arg);
  }
  else if (arg->m_p[1] == '-') {
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
              (&local_98,arg,2,0xffffffffffffffff);
    bVar1 = CmdLineParserRoot::parseSwitch
                      (ArgKind_StringSwitch,&local_98,(String *)&local_78,(String *)&local_58);
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
    if (bVar1) {
      pSVar4 = CmdLineSwitchTable::findSwitch(&local_78);
      if (pSVar4 == (SwitchInfo *)0x0) {
        pCVar5 = local_78.m_p;
        if (CONCAT71(local_78.m_length._1_7_,(undefined1)local_78.m_length) == 0) {
          pCVar5 = &StringDetailsImpl<char>::getEmptyString()::emptyString;
        }
        bVar2 = 0;
        err::setFormatStringError("unknown switch --%s",pCVar5);
      }
      else {
        bVar2 = processSwitch(this,pSVar4,&local_78,&local_58);
      }
    }
    else {
      bVar2 = 0;
    }
  }
  else {
    first = 1;
    bVar1 = false;
    do {
      pSVar4 = CmdLineSwitchTable::findSwitch(arg->m_p[first]);
      if (pSVar4 == (SwitchInfo *)0x0) {
        this = (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)0x0;
        err::setFormatStringError("unknown switch -%c",(ulong)(byte)arg->m_p[first]);
        goto LAB_0011f5d7;
      }
      if (pSVar4->m_value != (char *)0x0) {
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
                  (&local_98,arg,first,0xffffffffffffffff);
        bVar3 = CmdLineParserRoot::parseSwitch
                          (ArgKind_CharSwitch,&local_98,(String *)&local_78,(String *)&local_58);
        if (bVar3) {
          bVar3 = processSwitch(this,pSVar4,&local_78,&local_58);
          this = (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)(ulong)bVar3;
        }
        else {
          this = (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)0x0;
        }
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
        goto LAB_0011f5d7;
      }
      switchKind = pSVar4->m_switchKind;
      local_98.m_length._0_1_ = 0;
      local_98.m_length._1_7_ = 0;
      local_98.m_isNullTerminated = false;
      local_98.m_p = (C *)0x0;
      local_98.m_hdr._0_1_ = 0;
      local_98.m_hdr._1_7_ = 0;
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr(&local_98,(BufHdr *)0x0);
      local_98.m_p = (C *)0x0;
      local_98.m_length._0_1_ = 0;
      local_98.m_length._1_7_ = 0;
      local_98.m_isNullTerminated = false;
      CmdLineParser::onSwitch((CmdLineParser *)this,switchKind,&local_98);
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_98);
      first = first + 1;
      bVar1 = local_38 <= first;
    } while (first != local_38);
    bVar1 = true;
LAB_0011f5d7:
    bVar2 = bVar1 | (byte)this;
  }
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_58);
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_78);
  return (bool)(bVar2 & 1);
}

Assistant:

bool
	processArg(const sl::StringRef& arg) {
		bool result;

		T* self = static_cast<T*>(this);

		if (m_flags & Flag_Forward)
			return self->onValue(arg);

		sl::String switchName;
		sl::String value;

		ArgKind argKind = getArgKind(arg);
		switch (argKind) {
		case ArgKind_Value:
			return processValue(arg);

		case ArgKind_StringSwitch:
			result = parseSwitch(argKind, arg.getSubString(2), &switchName, &value);
			if (!result)
				return false;

			const SwitchInfo* switchInfo = SwitchTable::findSwitch(switchName);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch --%s", switchName.sz());
				return false;
			}

			return processSwitch(switchInfo, switchName, value);
		}

		ASSERT(argKind == ArgKind_CharSwitch);

		size_t length = arg.getLength();
		for (size_t i = 1; i < length; i++) {
			const SwitchInfo* switchInfo = SwitchTable::findSwitch(arg[i]);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch -%c", (uchar_t) arg [i]);
				return false;
			}

			if (switchInfo->m_value) {
				return
					parseSwitch(argKind, arg.getSubString(i), &switchName, &value) &&
					processSwitch(switchInfo, switchName, value);
			}

			result = self->onSwitch((SwitchKind)switchInfo->m_switchKind, NULL);
		}

		return true;
	}